

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O2

void __thiscall
intel_acbp_v1_t::intel_acbp_v1_t
          (intel_acbp_v1_t *this,kstream *p__io,kstruct *p__parent,intel_acbp_v1_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__intel_acbp_v1_t_001a22f0;
  (this->m_elements)._M_t.
  super___uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_*,_false>
  ._M_head_impl =
       (vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
        *)0x0;
  this->m__parent = p__parent;
  this->m__root = this;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
           *)&this->m_elements,(pointer)0x0);
  _read(this);
  return;
}

Assistant:

intel_acbp_v1_t::intel_acbp_v1_t(kaitai::kstream* p__io, kaitai::kstruct* p__parent, intel_acbp_v1_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = this; (void)p__root;
    m_elements = nullptr;
    _read();
}